

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_free(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  
  if (ref_subdiv == (REF_SUBDIV)0x0) {
    uVar1 = 2;
  }
  else {
    if (ref_subdiv->node != (REF_INT *)0x0) {
      free(ref_subdiv->node);
    }
    if (ref_subdiv->mark != (REF_INT *)0x0) {
      free(ref_subdiv->mark);
    }
    uVar1 = ref_edge_free(ref_subdiv->edge);
    if (uVar1 == 0) {
      free(ref_subdiv);
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xa3
             ,"ref_subdiv_free",(ulong)uVar1,"free edge");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_free(REF_SUBDIV ref_subdiv) {
  if (NULL == (void *)ref_subdiv) return REF_NULL;

  ref_free(ref_subdiv->node);
  ref_free(ref_subdiv->mark);
  RSS(ref_edge_free(ref_subdiv_edge(ref_subdiv)), "free edge");

  ref_free(ref_subdiv);

  return REF_SUCCESS;
}